

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

void __thiscall CVmObjClass::save_to_file(CVmObjClass *this,CVmFile *fp)

{
  uint *puVar1;
  char buf [5];
  
  puVar1 = (uint *)(this->super_CVmObject).ext_;
  CVmFile::write_uint2(fp,0xd);
  CVmFile::write_uint2(fp,*puVar1);
  CVmFile::write_uint4(fp,puVar1[1]);
  vmb_put_dh(buf,(vm_val_t *)(puVar1 + 2));
  CVmFile::write_bytes(fp,buf,5);
  return;
}

Assistant:

void CVmObjClass::save_to_file(VMG_ class CVmFile *fp)
{
    /* write our data: data size, meta table index, mod ID, class state */
    vm_intcls_ext *ext = get_ext();
    fp->write_uint2(2 + 2 + 4 + VMB_DATAHOLDER);
    fp->write_uint2(ext->meta_idx);
    fp->write_uint4(ext->mod_obj);

    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &ext->class_state);
    fp->write_bytes(buf, VMB_DATAHOLDER);
}